

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

sexp sexp_bignum_normalize(sexp a)

{
  sexp_uint_t sVar1;
  sexp_uint_t *psVar2;
  sexp in_RDI;
  sexp_uint_t *data;
  sexp local_8;
  
  local_8 = in_RDI;
  if ((((((ulong)in_RDI & 3) == 0) && (in_RDI->tag == 0xc)) &&
      (sVar1 = sexp_bignum_hi(in_RDI), sVar1 < 2)) &&
     ((psVar2 = &(in_RDI->value).string.length, *psVar2 < 0x4000000000000000 ||
      (((in_RDI->value).flonum_bits[0] == -1 && (*psVar2 == 0x4000000000000000)))))) {
    local_8 = (sexp)(*psVar2 * (long)(in_RDI->value).flonum_bits[0] * 2 | 1);
  }
  return local_8;
}

Assistant:

sexp sexp_bignum_normalize (sexp a) {
  sexp_uint_t *data;
  if ((! sexp_bignump(a)) || (sexp_bignum_hi(a)>1))
    return a;
  data = sexp_bignum_data(a);
  if ((data[0] > SEXP_MAX_FIXNUM)
      && ! ((sexp_bignum_sign(a) == -1) && (data[0] == SEXP_MAX_FIXNUM+1)))
    return a;
  return sexp_make_fixnum((sexp_sint_t)data[0] * sexp_bignum_sign(a));
}